

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_lzhuf.cxx
# Opt level: O2

void __thiscall xray_re::_lzhuf::InsertNode(_lzhuf *this,int r)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  
  iVar4 = this->text_buf[r] + 0x1001;
  this->lson[r] = 0x1000;
  this->rson[r] = 0x1000;
  this->match_length = 0;
  iVar3 = 1;
  uVar5 = this->match_position;
  uVar7 = 0;
LAB_00160955:
  do {
    if (iVar3 < 0) {
      iVar1 = this->lson[iVar4];
      if (iVar1 == 0x1000) {
        this->lson[iVar4] = r;
        goto LAB_00160a33;
      }
    }
    else {
      iVar1 = this->rson[iVar4];
      if (iVar1 == 0x1000) {
        this->rson[iVar4] = r;
LAB_00160a33:
        this->dad[r] = iVar4;
        return;
      }
    }
    iVar4 = iVar1;
    for (uVar9 = 1; uVar9 != 0x3c; uVar9 = uVar9 + 1) {
      iVar3 = (uint)this->text_buf[uVar9 + (long)r] - (uint)this->text_buf[uVar9 + (long)iVar4];
      if (iVar3 != 0) {
        if (uVar9 < 3) goto LAB_00160955;
        goto LAB_001609a8;
      }
      iVar3 = 0;
    }
    uVar9 = 0x3c;
LAB_001609a8:
    uVar8 = (uint)uVar9;
    if ((int)uVar7 < (int)uVar8) {
      uVar5 = (r - iVar4 & 0xfffU) - 1;
      this->match_position = uVar5;
      this->match_length = uVar8;
      uVar7 = uVar8;
      if (0x3b < uVar8) {
        this->dad[r] = this->dad[iVar4];
        this->lson[r] = this->lson[iVar4];
        this->rson[r] = this->rson[iVar4];
        this->dad[this->lson[iVar4]] = r;
        this->dad[this->rson[iVar4]] = r;
        piVar2 = this->lson;
        if (this->rson[this->dad[iVar4]] == iVar4) {
          piVar2 = this->rson;
        }
        piVar2[this->dad[iVar4]] = r;
        this->dad[iVar4] = 0x1000;
        return;
      }
    }
    if ((uVar8 == uVar7) && (uVar6 = (r - iVar4 & 0xfffU) - 1, uVar7 = uVar8, uVar6 < uVar5)) {
      this->match_position = uVar6;
      uVar5 = uVar6;
    }
  } while( true );
}

Assistant:

void _lzhuf::InsertNode(int r)  /* insert to tree */
{
	int  i, p, cmp;
	unsigned char  *key;
	unsigned c;

	cmp = 1;
	key = &text_buf[r];
	p = N + 1 + key[0];
	rson[r] = lson[r] = NIL;
	match_length = 0;
	for ( ; ; ) {
		if (cmp >= 0) {
			if (rson[p] != NIL)
				p = rson[p];
			else {
				rson[p] = r;
				dad[r] = p;
				return;
			}
		} else {
			if (lson[p] != NIL)
				p = lson[p];
			else {
				lson[p] = r;
				dad[r] = p;
				return;
			}
		}
		for (i = 1; i < F; i++)
			if ((cmp = key[i] - text_buf[p + i]) != 0)
				break;
		if (i > THRESHOLD) {
			if (i > match_length) {
				match_position = ((r - p) & (N - 1)) - 1;
				if ((match_length = i) >= F)
					break;
			}
			if (i == match_length) {
				if ((c = ((r - p) & (N - 1)) - 1) < (unsigned)match_position) {
					match_position = c;
				}
			}
		}
	}
	dad[r] = dad[p];
	lson[r] = lson[p];
	rson[r] = rson[p];
	dad[lson[p]] = r;
	dad[rson[p]] = r;
	if (rson[dad[p]] == p)
		rson[dad[p]] = r;
	else
		lson[dad[p]] = r;
	dad[p] = NIL;  /* remove p */
}